

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NinjaCommand.cpp
# Opt level: O0

int executeParseCommand(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *args,bool parseOnly)

{
  FILE *pFVar1;
  bool bVar2;
  size_type sVar3;
  char *pcVar4;
  undefined8 uVar5;
  reference ptVar6;
  pointer pMVar7;
  const_reference pvVar8;
  Error *E;
  StringRef SVar9;
  Parser local_100;
  Parser parser_1;
  undefined1 local_d8 [8];
  ParseCommandActions actions_1;
  Parser local_90;
  Parser parser;
  ParseOnlyCommandActions actions;
  string local_70;
  size_t local_50;
  undefined8 local_48;
  undefined1 local_40 [8];
  Expected<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>_>
  bufferOrError;
  bool parseOnly_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  
  bufferOrError._15_1_ = parseOnly;
  sVar3 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(args);
  pFVar1 = _stderr;
  if (sVar3 == 1) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[](args,0);
    local_50 = std::__cxx11::string::data();
    local_48 = std::__cxx11::string::length();
    SVar9.Length = local_50;
    SVar9.Data = local_40;
    llbuild::commands::util::readFileContents(SVar9);
    bVar2 = llvm::Expected::operator_cast_to_bool((Expected *)local_40);
    pFVar1 = _stderr;
    if (!bVar2) {
      pcVar4 = llbuild::commands::getProgramName();
      llvm::Expected<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>_>
      ::takeError((Expected<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>_>
                   *)&actions.parser);
      llvm::toString_abi_cxx11_(&local_70,(llvm *)&actions.parser,E);
      uVar5 = std::__cxx11::string::c_str();
      fprintf(pFVar1,"error: %s: %s\n",pcVar4,uVar5);
      std::__cxx11::string::~string((string *)&local_70);
      llvm::Error::~Error((Error *)&actions.parser);
      exit(1);
    }
    if ((bufferOrError._15_1_ & 1) == 0) {
      pvVar8 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](args,0);
      std::__cxx11::string::string((string *)&parser_1,(string *)pvVar8);
      anon_unknown.dwarf_5ec65::ParseCommandActions::ParseCommandActions
                ((ParseCommandActions *)local_d8,(string *)&parser_1);
      std::__cxx11::string::~string((string *)&parser_1);
      ptVar6 = llvm::
               Expected<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>_>
               ::get((Expected<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>_>
                      *)local_40);
      pMVar7 = std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>::
               operator->(ptVar6);
      SVar9 = llvm::MemoryBuffer::getBuffer(pMVar7);
      llbuild::ninja::Parser::Parser(&local_100,SVar9,(ParseActions *)local_d8);
      llbuild::ninja::Parser::parse(&local_100);
      llbuild::ninja::Parser::~Parser(&local_100);
      anon_unknown.dwarf_5ec65::ParseCommandActions::~ParseCommandActions
                ((ParseCommandActions *)local_d8);
    }
    else {
      anon_unknown.dwarf_5ec65::ParseOnlyCommandActions::ParseOnlyCommandActions
                ((ParseOnlyCommandActions *)&parser);
      ptVar6 = llvm::
               Expected<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>_>
               ::get((Expected<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>_>
                      *)local_40);
      pMVar7 = std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>::
               operator->(ptVar6);
      join_0x00000010_0x00000000_ = llvm::MemoryBuffer::getBuffer(pMVar7);
      llbuild::ninja::Parser::Parser(&local_90,join_0x00000010_0x00000000_,(ParseActions *)&parser);
      llbuild::ninja::Parser::parse(&local_90);
      llbuild::ninja::Parser::~Parser(&local_90);
      anon_unknown.dwarf_5ec65::ParseOnlyCommandActions::~ParseOnlyCommandActions
                ((ParseOnlyCommandActions *)&parser);
    }
    args_local._4_4_ = 0;
    llvm::Expected<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>_>::
    ~Expected((Expected<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>_>
               *)local_40);
  }
  else {
    pcVar4 = llbuild::commands::getProgramName();
    fprintf(pFVar1,"error: %s: invalid number of arguments\n",pcVar4);
    args_local._4_4_ = 1;
  }
  return args_local._4_4_;
}

Assistant:

static int executeParseCommand(const std::vector<std::string> &args,
                               bool parseOnly) {
  if (args.size() != 1) {
    fprintf(stderr, "error: %s: invalid number of arguments\n",
            getProgramName());
    return 1;
  }

  // Read the input.
  auto bufferOrError = util::readFileContents(args[0]);
  if (!bufferOrError) {
    fprintf(stderr, "error: %s: %s\n", getProgramName(),
            llvm::toString(bufferOrError.takeError()).c_str());
    exit(1);
  }

  // Run the parser.
  if (parseOnly) {
      ParseOnlyCommandActions actions;
      ninja::Parser parser(bufferOrError.get()->getBuffer(), actions);
      parser.parse();
  } else {
      ParseCommandActions actions(args[0]);
      ninja::Parser parser(bufferOrError.get()->getBuffer(), actions);
      parser.parse();
  }

  return 0;
}